

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

int __thiscall
ON_NurbsSurface::CreateRuledSurface
          (ON_NurbsSurface *this,ON_Curve *curveA,ON_Curve *curveB,ON_Interval *curveA_domain,
          ON_Interval *curveB_domain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double *Point;
  int local_120;
  int local_dc;
  int i;
  int is_rat;
  int srf_dim;
  undefined1 local_c0 [8];
  ON_NurbsCurve nurbs_curveB;
  ON_NurbsCurve nurbs_curveA;
  int rcB;
  int rcA;
  ON_Interval *curveB_domain_local;
  ON_Interval *curveA_domain_local;
  ON_Curve *curveB_local;
  ON_Curve *curveA_local;
  ON_NurbsSurface *this_local;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)&nurbs_curveB.m_cv);
  ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_c0);
  if ((this->m_cv != (double *)0x0) && (this->m_cv_capacity == 0)) {
    nurbs_curveA._48_8_ = this->m_cv;
  }
  local_120 = (*(curveA->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                        (0,curveA,&nurbs_curveB.m_cv,curveA_domain);
  if (local_120 < 1) {
    this_local._4_4_ = 0;
  }
  else {
    iVar2 = (*(curveB->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3f])
                      (0,curveB,local_c0,curveB_domain);
    if (iVar2 < 1) {
      this_local._4_4_ = 0;
    }
    else {
      bVar1 = ON_Internal_MakeKnotVectorsCompatible
                        ((ON_NurbsCurve *)&nurbs_curveB.m_cv,(ON_NurbsCurve *)local_c0);
      if (bVar1) {
        if (nurbs_curveA.m_is_rat == nurbs_curveB.m_is_rat) {
          if (nurbs_curveA.m_dim == nurbs_curveB.m_dim) {
            i = 3;
            iVar3 = ON_NurbsCurve::Dimension((ON_NurbsCurve *)&nurbs_curveB.m_cv);
            if (3 < iVar3) {
              i = ON_NurbsCurve::Dimension((ON_NurbsCurve *)&nurbs_curveB.m_cv);
            }
            iVar3 = ON_NurbsCurve::Dimension((ON_NurbsCurve *)local_c0);
            if (i < iVar3) {
              i = ON_NurbsCurve::Dimension((ON_NurbsCurve *)local_c0);
            }
            iVar3 = ON_NurbsCurve::Dimension((ON_NurbsCurve *)&nurbs_curveB.m_cv);
            if (iVar3 < i) {
              ON_NurbsCurve::ChangeDimension((ON_NurbsCurve *)&nurbs_curveB.m_cv,i);
            }
            else {
              iVar3 = ON_NurbsCurve::Dimension((ON_NurbsCurve *)local_c0);
              if (iVar3 < i) {
                ON_NurbsCurve::ChangeDimension((ON_NurbsCurve *)local_c0,i);
              }
            }
            bVar1 = ON_NurbsCurve::IsRational((ON_NurbsCurve *)&nurbs_curveB.m_cv);
            if (bVar1) {
              ON_NurbsCurve::MakeRational((ON_NurbsCurve *)local_c0);
            }
            else {
              bVar1 = ON_NurbsCurve::IsRational((ON_NurbsCurve *)local_c0);
              if (bVar1) {
                ON_NurbsCurve::MakeRational((ON_NurbsCurve *)&nurbs_curveB.m_cv);
              }
            }
            if ((nurbs_curveA.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._4_4_
                != 0) != 0) {
              nurbs_curveA.super_ON_Curve.super_ON_Geometry.super_ON_Object.m_userdata_list._0_4_ =
                   (int)nurbs_curveA.super_ON_Curve.super_ON_Geometry.super_ON_Object.
                        m_userdata_list + 1;
            }
            ON_NurbsCurve::ChangeDimension
                      ((ON_NurbsCurve *)&nurbs_curveB.m_cv,
                       (int)nurbs_curveA.super_ON_Curve.super_ON_Geometry.super_ON_Object.
                            m_userdata_list * 2);
            if ((this->m_cv != (double *)0x0) && (0 < this->m_cv_capacity)) {
              onfree(this->m_cv);
            }
            this->m_cv = (double *)nurbs_curveA._48_8_;
            this->m_cv_capacity = nurbs_curveA.m_knot._4_4_;
            if ((this->m_knot[0] != (double *)0x0) && (0 < this->m_knot_capacity[0])) {
              onfree(this->m_knot[0]);
            }
            ON_NurbsCurve::UnmanageKnotForExperts
                      ((ON_NurbsCurve *)&nurbs_curveB.m_cv,this->m_knot_capacity,this->m_knot);
            ReserveKnotCapacity(this,1,2);
            *this->m_knot[1] = 0.0;
            this->m_knot[1][1] = 1.0;
            this->m_dim = i;
            this->m_is_rat =
                 (uint)(nurbs_curveA.super_ON_Curve.super_ON_Geometry.super_ON_Object.
                        m_userdata_list._4_4_ != 0);
            this->m_order[0] = nurbs_curveA.m_dim;
            this->m_order[1] = 2;
            this->m_cv_count[0] = nurbs_curveA.m_is_rat;
            this->m_cv_count[1] = 2;
            this->m_cv_stride[0] = (int)nurbs_curveA.m_knot;
            this->m_cv_stride[1] = this->m_cv_stride[0] / 2;
            for (local_dc = 0; local_dc < this->m_cv_count[0]; local_dc = local_dc + 1) {
              Point = ON_NurbsCurve::CV((ON_NurbsCurve *)local_c0,local_dc);
              SetCV(this,local_dc,1,intrinsic_point_style,Point);
            }
            if (local_120 <= iVar2) {
              local_120 = iVar2;
            }
            this_local._4_4_ = local_120;
          }
          else {
            this_local._4_4_ = 0;
          }
        }
        else {
          this_local._4_4_ = 0;
        }
      }
      else {
        this_local._4_4_ = 0;
      }
    }
  }
  ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_c0);
  ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)&nurbs_curveB.m_cv);
  return this_local._4_4_;
}

Assistant:

int ON_NurbsSurface::CreateRuledSurface(
       const ON_Curve& curveA,
       const ON_Curve& curveB,
       const ON_Interval* curveA_domain,
       const ON_Interval* curveB_domain
       )
{
  DestroySurfaceTree();
  int rcA=1, rcB=1;
  ON_NurbsCurve nurbs_curveA, nurbs_curveB;
  if ( m_cv && m_cv_capacity == 0 )
    nurbs_curveA.m_cv = m_cv;
  if ( m_knot[0] && m_knot_capacity[0] == 0 )
    nurbs_curveA.m_knot = m_knot[0];
  rcA = curveA.GetNurbForm( nurbs_curveA, 0.0, curveA_domain );
  if ( rcA<=0 )
    return 0;
  rcB = curveB.GetNurbForm( nurbs_curveB, 0.0, curveB_domain );
  if ( rcB<=0 )
    return 0;

  if ( !ON_Internal_MakeKnotVectorsCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;

  if ( nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count )
    return 0;
  if ( nurbs_curveA.m_order != nurbs_curveB.m_order )
    return 0;

  int srf_dim = 3;
  if ( nurbs_curveA.Dimension() > srf_dim )
    srf_dim = nurbs_curveA.Dimension();
  if ( nurbs_curveB.Dimension() > srf_dim )
    srf_dim = nurbs_curveB.Dimension();

  if (nurbs_curveA.Dimension() < srf_dim )
    nurbs_curveA.ChangeDimension(srf_dim);
  else if (nurbs_curveB.Dimension() < srf_dim )
    nurbs_curveB.ChangeDimension(srf_dim);

  if ( nurbs_curveA.IsRational() )
    nurbs_curveB.MakeRational();
  else if ( nurbs_curveB.IsRational() )
    nurbs_curveA.MakeRational();

  // reserve enough room in nurbs_curveA.m_cv 
  // for two rows of surface cvs.
  const int is_rat = nurbs_curveA.m_is_rat ? 1 : 0;
  if ( is_rat )
  {
    nurbs_curveA.m_is_rat = 0;
    nurbs_curveA.m_dim++;
  }
  nurbs_curveA.ChangeDimension( 2*nurbs_curveA.m_dim );
  nurbs_curveA.m_dim = srf_dim;
  nurbs_curveA.m_is_rat = is_rat;

  // transfer m_cv and m_knot[0] memory from nurbs_curveA to
  // this nurbs surface.
  if ( m_cv && m_cv_capacity > 0 )
    onfree(m_cv);
  m_cv = nurbs_curveA.m_cv;
  m_cv_capacity = nurbs_curveA.m_cv_capacity;
  nurbs_curveA.m_cv_capacity = 0;

  if ( m_knot[0] && m_knot_capacity[0] > 0 )
    onfree(m_knot[0]);

  // transfer knot vector from nurbs_curveA to srf.m_knot[0]
  nurbs_curveA.UnmanageKnotForExperts(m_knot_capacity[0], m_knot[0]);

  // Fill in linear knots
  ReserveKnotCapacity( 1, 2 );
  m_knot[1][0] = 0.0;
  m_knot[1][1] = 1.0;

  m_dim = srf_dim;
  m_is_rat = nurbs_curveA.m_is_rat;
  m_order[0] = nurbs_curveA.m_order;
  m_order[1] = 2;
  m_cv_count[0] = nurbs_curveA.m_cv_count;
  m_cv_count[1] = 2;
  m_cv_stride[0] = nurbs_curveA.m_cv_stride;
  m_cv_stride[1] = m_cv_stride[0]/2;

  // fill in "B" row of cvs
  for ( int i = 0; i < m_cv_count[0]; i++ )
  {
    SetCV(i,1,ON::intrinsic_point_style, nurbs_curveB.CV(i));
  }

  return ((rcA<=rcB) ? rcB : rcA);
}